

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

PyObject * __thiscall
boost::python::detail::caller_arity<3U>::
impl<NeuralConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::mpl::vector4<NeuralConsumer_python_*,_PythonModuleClient_&,_unsigned_long,_boost::python::list_&>_>
::operator()(impl<NeuralConsumer_python_*(PythonModuleClient::*)(unsigned_long,_boost::python::list_&),_boost::python::return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>,_boost::mpl::vector4<NeuralConsumer_python_*,_PythonModuleClient_&,_unsigned_long,_boost::python::list_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  bool bVar1;
  PyObject *pPVar2;
  c_t2 c2;
  c_t0 c0;
  c_t1 c1;
  undefined1 local_49;
  object_base local_48;
  arg_lvalue_from_python_base local_40;
  arg_rvalue_from_python<unsigned_long> local_38;
  
  converter::reference_arg_from_python<PythonModuleClient_&>::reference_arg_from_python
            ((reference_arg_from_python<PythonModuleClient_&> *)&local_40,
             (PyObject *)args_[1].ob_type);
  if ((local_40.m_result != (void *)0x0) &&
     (converter::arg_rvalue_from_python<unsigned_long>::arg_rvalue_from_python
                (&local_38,(PyObject *)args_[2].ob_refcnt),
     local_38.m_data.super_rvalue_from_python_storage<unsigned_long_&>.stage1.convertible !=
     (void *)0x0)) {
    local_48.m_ptr = (PyObject *)args_[2].ob_type;
    (((PyTypeObject *)local_48.m_ptr)->ob_base).ob_base.ob_refcnt =
         (((PyTypeObject *)local_48.m_ptr)->ob_base).ob_base.ob_refcnt + 1;
    bVar1 = converter::pyobject_type<boost::python::list,_&PyList_Type>::check(local_48.m_ptr);
    if (bVar1) {
      pPVar2 = invoke<boost::python::to_python_indirect<NeuralConsumer_python*,boost::python::detail::make_owning_holder>,NeuralConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::arg_from_python<PythonModuleClient&>,boost::python::arg_from_python<unsigned_long>,boost::python::arg_from_python<boost::python::list&>>
                         (&local_49,this,&local_40,&local_38,&local_48);
    }
    else {
      pPVar2 = (PyObject *)0x0;
    }
    api::object_base::~object_base(&local_48);
    return pPVar2;
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }